

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

FeatureOptions<wasm::Type::BasicType> * __thiscall
wasm::Random::FeatureOptions<wasm::Type::BasicType>::
add<wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType>
          (FeatureOptions<wasm::Type::BasicType> *this,FeatureSet feature,BasicType option,
          BasicType rest,BasicType rest_1,BasicType rest_2)

{
  iterator __position;
  vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>> *this_00;
  FeatureOptions<wasm::Type::BasicType> *pFVar1;
  FeatureSet local_38;
  BasicType local_34;
  FeatureSet feature_local;
  BasicType option_local;
  
  _local_38 = CONCAT44(option,feature.features);
  this_00 = (vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
            ::operator[](&this->options,&local_38);
  __position._M_current = *(BasicType **)(this_00 + 8);
  if (__position._M_current == *(BasicType **)(this_00 + 0x10)) {
    std::vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>>::
    _M_realloc_insert<wasm::Type::BasicType_const&>(this_00,__position,&local_34);
  }
  else {
    *__position._M_current = option;
    *(BasicType **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<wasm::Type::BasicType,wasm::Type::BasicType>(this,local_38,rest,rest_1,rest_2);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }